

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

CMFormat old_CMregister_format
                   (CManager cm,char *format_name,FMFieldList field_list,CMFormatList subformat_list
                   )

{
  undefined8 *puVar1;
  FMFieldList list;
  int iVar2;
  FMStructDescList format_list;
  CMFormat p_Var3;
  uint uVar4;
  int pointer_size;
  char *pcVar5;
  
  uVar4 = 0;
  if (subformat_list != (CMFormatList)0x0) {
    uVar4 = (uint)(subformat_list->format_name != (char *)0x0);
  }
  pcVar5 = format_name;
  format_list = (FMStructDescList)INT_CMmalloc((ulong)(uVar4 * 0x20 + 0x40));
  format_list->format_name = format_name;
  format_list->field_list = field_list;
  pointer_size = (int)pcVar5;
  iVar2 = struct_size_field_list(field_list,pointer_size);
  format_list->struct_size = iVar2;
  format_list->opt_info = (FMOptInfo *)0x0;
  if (uVar4 != 0) {
    format_list[1].format_name = subformat_list->format_name;
    list = subformat_list->field_list;
    format_list[1].field_list = list;
    iVar2 = struct_size_field_list(list,pointer_size);
    format_list[1].struct_size = iVar2;
    format_list[1].opt_info = (FMOptInfo *)0x0;
  }
  puVar1 = (undefined8 *)((long)&format_list[1].format_name + (ulong)(uVar4 * 0x20));
  *puVar1 = 0;
  puVar1[1] = 0;
  p_Var3 = CMregister_format(cm,format_list);
  return p_Var3;
}

Assistant:

extern CMFormat
old_CMregister_format(CManager cm, char *format_name,
		      FMFieldList field_list, CMFormatList subformat_list)
{
    FMStructDescList structs;
    int sub_count = 0, i;
    if (subformat_list && (subformat_list[sub_count].format_name != NULL)) sub_count++;
    structs = malloc(sizeof(structs[0]) * (sub_count + 2));
    structs[0].format_name = format_name;
    structs[0].field_list = field_list;
    structs[0].struct_size = struct_size_field_list(field_list, (int)sizeof(char*));
    structs[0].opt_info = NULL;
    for (i = 0; i < sub_count; i++) {
	structs[i+1].format_name = subformat_list[i].format_name;
	structs[i+1].field_list = subformat_list[i].field_list;
	structs[i+1].struct_size = struct_size_field_list(structs[i+1].field_list, (int)sizeof(char*));
	structs[i+1].opt_info = NULL;
    }
    structs[sub_count+1].format_name = NULL;
    structs[sub_count+1].field_list = NULL;
    return CMregister_format(cm, structs);
}